

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O0

bool __thiscall V4L2Device::set_format(V4L2Device *this)

{
  int iVar1;
  Writer *pWVar2;
  int *piVar3;
  int *in_RDI;
  bool ok;
  v4l2_format format;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 uVar4;
  undefined2 in_stack_fffffffffffffe4c;
  DispatchAction in_stack_fffffffffffffe4e;
  Writer *in_stack_fffffffffffffe50;
  bool *in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  Writer *in_stack_fffffffffffffe70;
  VerboseLevel in_stack_fffffffffffffe80;
  Writer local_178;
  byte local_e1;
  undefined4 local_e0 [4];
  undefined4 local_d0;
  bool local_1;
  
  memset(local_e0,0,0xd0);
  local_e0[0] = 1;
  local_d0 = 0x47504a4d;
  parse_resolution((V4L2Device *)format.fmt.win.clips);
  std::tie<bool,unsigned_int,unsigned_int>
            (in_stack_fffffffffffffe58,(uint *)in_stack_fffffffffffffe50,
             (uint *)CONCAT26(in_stack_fffffffffffffe4e,
                              CONCAT24(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)));
  std::tuple<bool&,unsigned_int&,unsigned_int&>::operator=
            ((tuple<bool_&,_unsigned_int_&,_unsigned_int_&> *)in_stack_fffffffffffffe50,
             (tuple<bool,_unsigned_int,_unsigned_int> *)
             CONCAT26(in_stack_fffffffffffffe4e,
                      CONCAT24(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48)));
  if ((local_e1 & 1) == 0) {
    local_1 = false;
  }
  else {
    iVar1 = ioctl(*in_RDI,0xc0d05605,local_e0);
    if (iVar1 < 0) {
      uVar4 = 0;
      pWVar2 = &local_178;
      el::base::Writer::Writer
                (in_stack_fffffffffffffe70,(Level)((ulong)in_RDI >> 0x30),in_stack_fffffffffffffe60,
                 (LineNumber)pWVar2,(char *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4e,
                 in_stack_fffffffffffffe80);
      el::base::Writer::construct(pWVar2,1,el::base::consts::kDefaultLoggerId);
      pWVar2 = el::base::Writer::operator<<
                         (in_stack_fffffffffffffe50,
                          (char (*) [22])
                          CONCAT26(in_stack_fffffffffffffe4e,
                                   CONCAT24(in_stack_fffffffffffffe4c,uVar4)));
      piVar3 = __errno_location();
      strerror(*piVar3);
      el::base::Writer::operator<<
                (pWVar2,(char **)CONCAT26(in_stack_fffffffffffffe4e,
                                          CONCAT24(in_stack_fffffffffffffe4c,uVar4)));
      el::base::Writer::~Writer(pWVar2);
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool
    set_format()
    {
        struct v4l2_format format;
        std::memset(&format, 0, sizeof(format));

        format.type = V4L2_BUF_TYPE_VIDEO_CAPTURE;
        format.fmt.pix.pixelformat = V4L2_PIX_FMT_MJPEG;
        bool ok;

        std::tie(ok, format.fmt.pix.width, format.fmt.pix.height) = parse_resolution();

        if (not ok) {
            return false;
        }

        if (ioctl(fd, VIDIOC_S_FMT, &format) < 0) {
            LOG(ERROR) << "VIDIOC_S_FMT failed: " << strerror(errno);
            return false;
        }

        return true;
    }